

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederateManager::getInput(ValueFederateManager *this,string_view key)

{
  bool bVar1;
  handle inpHandle;
  BlockIterator<helics::Input,_32,_helics::Input_**> inpF;
  handle local_60;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_60,&this->inputs);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,local_60.data,key);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
            (&local_30,&(local_60.data)->dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                    ((BlockIterator<helics::Input,32,helics::Input**> *)&local_48,&local_30);
  if (!bVar1) {
    local_48.ptr = (Input *)invalidIptNC;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60.m_handle_lock);
  return local_48.ptr;
}

Assistant:

Input& ValueFederateManager::getInput(std::string_view key)
{
    auto inpHandle = inputs.lock();
    auto inpF = inpHandle->find(key);
    if (inpF != inpHandle->end()) {
        return *inpF;
    }
    return invalidIptNC;
}